

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<int>::resizeRealloc<slang::SmallVectorBase<int>::ValueInitTag>
          (SmallVectorBase<int> *this,size_type newSize,ValueInitTag *val)

{
  int *piVar1;
  size_type sVar2;
  pointer piVar3;
  iterator __result;
  int *in_RSI;
  EVP_PKEY_CTX *ctx;
  SmallVectorBase<int> *in_RDI;
  pointer newData;
  size_type newCap;
  int *__last;
  SmallVectorBase<int> *in_stack_ffffffffffffffd8;
  
  __last = in_RSI;
  piVar1 = (int *)max_size((SmallVectorBase<int> *)0x21a8c3);
  if (piVar1 < __last) {
    detail::throwLengthError();
  }
  sVar2 = calculateGrowth(in_stack_ffffffffffffffd8,(size_type)in_RDI);
  piVar3 = (pointer)operator_new(0x21a8f7);
  __result = begin(in_RDI);
  end(in_RDI);
  std::uninitialized_move<int*,int*>((int *)in_RDI,__last,__result);
  ctx = (EVP_PKEY_CTX *)(piVar3 + in_RDI->len);
  std::ranges::__uninitialized_value_construct_n_fn::operator()<int_*>
            ((__uninitialized_value_construct_n_fn *)in_RDI,__last,
             (iter_difference_t<int_*>)__result);
  cleanup(in_RDI,ctx);
  in_RDI->len = (size_type)in_RSI;
  in_RDI->cap = sVar2;
  in_RDI->data_ = piVar3;
  return;
}

Assistant:

void SmallVectorBase<T>::resizeRealloc(size_type newSize, const TVal& val) {
    SLANG_ASSERT(newSize > len);
    if (newSize > max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(newSize);
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    std::uninitialized_move(begin(), end(), newData);

    if constexpr (std::is_same_v<T, TVal>) {
        std::ranges::uninitialized_fill_n(newData + len, ptrdiff_t(newSize - len), val);
    }
    else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
        std::ranges::uninitialized_default_construct_n(newData + len, ptrdiff_t(newSize - len));
    }
    else {
        std::ranges::uninitialized_value_construct_n(newData + len, ptrdiff_t(newSize - len));
    }

    cleanup();
    len = newSize;
    cap = newCap;
    data_ = newData;
}